

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::Data
          (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *this,
          Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *other,size_t reserved)

{
  uchar *puVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  QSocketNotifier *pQVar6;
  QSocketNotifier *pQVar7;
  QSocketNotifier *pQVar8;
  Node<int,_QSocketNotifierSetUNIX> *pNVar9;
  long lVar10;
  ulong uVar11;
  size_t numBuckets;
  long lVar12;
  long in_FS_OFFSET;
  R_conflict7 RVar13;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar3 = other->size;
  this->size = uVar3;
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  if (reserved < uVar3) {
    reserved = uVar3;
  }
  numBuckets = 0x80;
  if (0x40 < reserved) {
    if (reserved >> 0x3e == 0) {
      lVar10 = 0x3f;
      if (reserved != 0) {
        for (; reserved >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar10 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  this->numBuckets = numBuckets;
  RVar13 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar13.spans;
  uVar3 = other->numBuckets;
  lVar10 = 0;
  for (uVar11 = 0; uVar11 != uVar3 >> 7; uVar11 = uVar11 + 1) {
    pSVar4 = other->spans;
    for (lVar12 = 0; lVar12 != 0x80; lVar12 = lVar12 + 1) {
      bVar2 = pSVar4->offsets[lVar12 + lVar10];
      if (bVar2 != 0xff) {
        pEVar5 = pSVar4[uVar11].entries;
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = findBucket<int>(this,(int *)(pEVar5 + bVar2));
        pNVar9 = Bucket::insert(&local_48);
        pQVar6 = *(QSocketNotifier **)(pEVar5[bVar2].storage.data + 8);
        puVar1 = pEVar5[bVar2].storage.data + 0x10;
        pQVar7 = *(QSocketNotifier **)puVar1;
        pQVar8 = *(QSocketNotifier **)(puVar1 + 8);
        *(undefined8 *)pNVar9 = *(undefined8 *)pEVar5[bVar2].storage.data;
        (pNVar9->value).notifiers[0] = pQVar6;
        (pNVar9->value).notifiers[1] = pQVar7;
        (pNVar9->value).notifiers[2] = pQVar8;
      }
    }
    lVar10 = lVar10 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }